

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O1

ptr_t __thiscall
aeron::util::MemoryMappedFile::createNew
          (MemoryMappedFile *this,char *filename,off_t offset,size_t size)

{
  bool bVar1;
  FileHandle fd_00;
  long *plVar2;
  MemoryMappedFile *this_00;
  SourcedException *pSVar3;
  char *pcVar4;
  size_type *psVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr_t pVar6;
  FileHandle fd;
  allocator local_b5;
  FileHandle local_b4;
  string local_b0;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  fd_00.handle = open64(filename,0x42,0x1b6);
  local_b4.handle = fd_00.handle;
  if (fd_00.handle < 0) {
    pSVar3 = (SourcedException *)__cxa_allocate_exception(0x48);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"failed to create file: ","")
    ;
    plVar2 = (long *)std::__cxx11::string::append((char *)local_70);
    local_b0._M_dataplus._M_p = (pointer)*plVar2;
    psVar5 = (size_type *)(plVar2 + 2);
    if ((size_type *)local_b0._M_dataplus._M_p == psVar5) {
      local_b0.field_2._M_allocated_capacity = *psVar5;
      local_b0.field_2._8_4_ = (undefined4)plVar2[3];
      local_b0.field_2._12_4_ = *(undefined4 *)((long)plVar2 + 0x1c);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar5;
    }
    local_b0._M_string_length = plVar2[1];
    *plVar2 = (long)psVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,
               "static MemoryMappedFile::ptr_t aeron::util::MemoryMappedFile::createNew(const char *, off_t, size_t)"
               ,"");
    pcVar4 = past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/util/MemoryMappedFile.cpp"
                        );
    std::__cxx11::string::string((string *)&local_50,pcVar4,&local_b5);
    SourcedException::SourcedException(pSVar3,&local_b0,&local_90,&local_50,0x7f);
    *(undefined ***)pSVar3 = &PTR__SourcedException_00162b60;
    __cxa_throw(pSVar3,&IOException::typeinfo,SourcedException::~SourcedException);
  }
  plVar2 = (long *)operator_new(0x10);
  *plVar2 = (long)&PTR__FuncHolder_00162b88;
  plVar2[1] = (long)&local_b4;
  bVar1 = fill(fd_00,size,'\0');
  if (bVar1) {
    this_00 = (MemoryMappedFile *)operator_new(0x10);
    MemoryMappedFile(this_00,local_b4,offset,size);
    this->m_memory = (uint8_t *)this_00;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<aeron::util::MemoryMappedFile*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->m_memorySize,this_00);
    (**(code **)(*plVar2 + 8))(plVar2);
    pVar6.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    pVar6.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         this;
    return (ptr_t)pVar6.
                  super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>;
  }
  pSVar3 = (SourcedException *)__cxa_allocate_exception(0x48);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"failed to write to file: ","")
  ;
  plVar2 = (long *)std::__cxx11::string::append((char *)local_70);
  local_b0._M_dataplus._M_p = (pointer)*plVar2;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar5) {
    local_b0.field_2._M_allocated_capacity = *psVar5;
    local_b0.field_2._8_4_ = (undefined4)plVar2[3];
    local_b0.field_2._12_4_ = *(undefined4 *)((long)plVar2 + 0x1c);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar5;
  }
  local_b0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "static MemoryMappedFile::ptr_t aeron::util::MemoryMappedFile::createNew(const char *, off_t, size_t)"
             ,"");
  pcVar4 = past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/util/MemoryMappedFile.cpp"
                      );
  std::__cxx11::string::string((string *)&local_50,pcVar4,&local_b5);
  SourcedException::SourcedException(pSVar3,&local_b0,&local_90,&local_50,0x89);
  *(undefined ***)pSVar3 = &PTR__SourcedException_00162b60;
  __cxa_throw(pSVar3,&IOException::typeinfo,SourcedException::~SourcedException);
}

Assistant:

MemoryMappedFile::ptr_t MemoryMappedFile::createNew(const char *filename, off_t offset, size_t size)
{
    FileHandle fd;
    fd.handle = open(filename, O_RDWR|O_CREAT, 0666);

    if (fd.handle < 0)
    {
        throw IOException(std::string("failed to create file: ") + filename, SOURCEINFO);
    }

    OnScopeExit tidy([&]()
    {
        close(fd.handle);
    });

    if (!fill(fd, size, 0))
    {
        throw IOException(std::string("failed to write to file: ") + filename, SOURCEINFO);
    }

    return MemoryMappedFile::ptr_t(new MemoryMappedFile(fd, offset, size));
}